

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_flyweight.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  User *usr;
  flyweight<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
  *this;
  long lVar2;
  initializer_list<User> __l;
  vector<User,_std::allocator<User>_> users;
  allocator_type local_1d9;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  vector<User,_std::allocator<User>_> local_98;
  User local_80;
  User local_70;
  User local_60;
  User local_50;
  User local_40;
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"John","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Doe","");
  User::User(&local_80,&local_f8,&local_118);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Mark","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Doe","");
  User::User(&local_70,&local_138,&local_158);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Jane","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Doe","");
  User::User(&local_60,&local_178,&local_198);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"Mike","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Doe","");
  User::User(&local_50,&local_1b8,&local_1d8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Jill","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Doe","");
  User::User(&local_40,&local_b8,&local_d8);
  __l._M_len = 5;
  __l._M_array = &local_80;
  std::vector<User,_std::allocator<User>_>::vector(&local_98,__l,&local_1d9);
  lVar2 = -0x50;
  this = &local_40.m_last_name;
  do {
    boost::flyweights::detail::
    refcounted_handle<const_boost::flyweights::detail::refcounted_value<boost::flyweights::detail::default_value_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::rep_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_boost::flyweights::detail::flyweight_core_tracking_helper<boost::flyweights::detail::default_value_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::na,_boost::flyweights::refcounted,_boost::flyweights::hashed_factory<mpl_::na,_mpl_::na,_mpl_::na,_0>,_boost::flyweights::simple_locking,_boost::flyweights::static_holder>_>
    ::~refcounted_handle(&this->h);
    boost::flyweights::detail::
    refcounted_handle<const_boost::flyweights::detail::refcounted_value<boost::flyweights::detail::default_value_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::rep_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_boost::flyweights::detail::flyweight_core_tracking_helper<boost::flyweights::detail::default_value_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::na,_boost::flyweights::refcounted,_boost::flyweights::hashed_factory<mpl_::na,_mpl_::na,_mpl_::na,_0>,_boost::flyweights::simple_locking,_boost::flyweights::static_holder>_>
    ::~refcounted_handle
              ((refcounted_handle<const_boost::flyweights::detail::refcounted_value<boost::flyweights::detail::default_value_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::rep_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_boost::flyweights::detail::flyweight_core_tracking_helper<boost::flyweights::detail::default_value_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::na,_boost::flyweights::refcounted,_boost::flyweights::hashed_factory<mpl_::na,_mpl_::na,_mpl_::na,_0>,_boost::flyweights::simple_locking,_boost::flyweights::static_holder>_>
                *)(this + -1));
    this = this + -2;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  for (; local_98.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         local_98.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      local_98.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
      _M_start = local_98.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    poVar1 = operator<<((ostream *)&std::cout,
                        local_98.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                        super__Vector_impl_data._M_start);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  std::vector<User,_std::allocator<User>_>::~vector(&local_98);
  return 0;
}

Assistant:

int main()
{
	std::vector<User> users{
		User{"John", "Doe"},
		User{"Mark", "Doe"},
		User{"Jane", "Doe"},
		User{"Mike", "Doe"},
		User{"Jill", "Doe"},
	};

	for(const auto& usr : users)
	{
		std::cout << usr << std::endl;
	}

	return 0;
}